

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getOpenFileImpl<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,int FD,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
          int64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  bool bVar1;
  int iVar2;
  file_type fVar3;
  MemoryBufferMMapFile<llvm::MemoryBuffer> *this;
  pointer this_00;
  int *piVar4;
  error_category *__cat;
  error_code EC_00;
  error_code EC_01;
  error_code eVar5;
  error_code local_140;
  unsigned_long local_130;
  int local_124;
  long local_120;
  ssize_t NumRead;
  size_t BytesLeft;
  char *BufPtr;
  error_category *local_100;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> Buf;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_e0;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> Result;
  error_code EC_1;
  file_type Type;
  undefined1 local_98 [8];
  error_code EC;
  file_status Status;
  bool IsVolatile_local;
  bool RequiresNullTerminator_local;
  int64_t Offset_local;
  uint64_t MapSize_local;
  uint64_t FileSize_local;
  Twine *Filename_local;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  *pEStack_10;
  int FD_local;
  
  Filename_local._4_4_ = FD;
  pEStack_10 = __return_storage_ptr__;
  if ((getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
       ::PageSize == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                                   ::PageSize), iVar2 != 0)) {
    getOpenFileImpl<llvm::MemoryBuffer>::PageSize = llvm::sys::Process::getPageSize();
    __cxa_guard_release(&getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                         ::PageSize);
  }
  Offset_local = MapSize;
  MapSize_local = FileSize;
  if (MapSize == 0xffffffffffffffff) {
    if (FileSize == 0xffffffffffffffff) {
      llvm::sys::fs::file_status::file_status((file_status *)&EC._M_cat);
      eVar5 = llvm::sys::fs::status(Filename_local._4_4_,(file_status *)&EC._M_cat);
      EC._0_8_ = eVar5._M_cat;
      local_98._0_4_ = eVar5._M_value;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_98);
      if (bVar1) {
        eVar5._4_4_ = 0;
        eVar5._M_value = local_98._0_4_;
        eVar5._M_cat = (error_category *)EC._0_8_;
        llvm::
        ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
        ErrorOr(__return_storage_ptr__,eVar5);
        return __return_storage_ptr__;
      }
      fVar3 = llvm::sys::fs::basic_file_status::type((basic_file_status *)&EC._M_cat);
      if ((fVar3 != regular_file) && (fVar3 != block_file)) {
        getMemoryBufferForStream
                  ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&EC_1._M_cat,Filename_local._4_4_,Filename);
        llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
        ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                  ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                    *)__return_storage_ptr__,
                   (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&EC_1._M_cat,(type *)0x0);
        llvm::
        ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
        ::~ErrorOr((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&EC_1._M_cat);
        return __return_storage_ptr__;
      }
      MapSize_local = llvm::sys::fs::basic_file_status::getSize((basic_file_status *)&EC._M_cat);
    }
    Offset_local = MapSize_local;
  }
  bVar1 = shouldUseMmap(Filename_local._4_4_,MapSize_local,Offset_local,Offset,
                        RequiresNullTerminator,getOpenFileImpl<llvm::MemoryBuffer>::PageSize,
                        IsVolatile);
  if (bVar1) {
    std::error_code::error_code((error_code *)&Result);
    anon_unknown.dwarf_1ee62d::NamedBufferAlloc::NamedBufferAlloc
              ((NamedBufferAlloc *)&stack0xffffffffffffff18,Filename);
    this = (MemoryBufferMMapFile<llvm::MemoryBuffer> *)
           operator_new(0x30,(NamedBufferAlloc *)&stack0xffffffffffffff18);
    anon_unknown.dwarf_1ee62d::MemoryBufferMMapFile<llvm::MemoryBuffer>::MemoryBufferMMapFile
              (this,RequiresNullTerminator,Filename_local._4_4_,Offset_local,Offset,
               (error_code *)&Result);
    std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
              ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)&local_e0,
               (pointer)this);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&Result);
    if (!bVar1) {
      llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)__return_storage_ptr__,&local_e0,(type *)0x0);
    }
    Buf._M_t.
    super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl._5_3_ = 0;
    Buf._M_t.
    super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl._4_1_ = !bVar1;
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (&local_e0);
    if (Buf._M_t.
        super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
        ._M_t.
        super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
        .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl._4_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&stack0xffffffffffffff08,Offset_local,Filename);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffff08);
  if (bVar1) {
    this_00 = std::
              unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
              ::get((unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                     *)&stack0xffffffffffffff08);
    BytesLeft = (size_t)llvm::WritableMemoryBuffer::getBufferStart(this_00);
    for (NumRead = Offset_local; NumRead != 0; NumRead = NumRead - local_120) {
      local_124 = -1;
      local_130 = (Offset_local - NumRead) + Offset;
      local_120 = llvm::sys::
                  RetryAfterSignal<int,long(int,void*,unsigned_long,long),int,char*,unsigned_long,unsigned_long>
                            (&local_124,pread,(int *)((long)&Filename_local + 4),(char **)&BytesLeft
                             ,(unsigned_long *)&NumRead,&local_130);
      if (local_120 == -1) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        __cat = (error_category *)std::_V2::generic_category();
        std::error_code::error_code(&local_140,iVar2,__cat);
        EC_01._4_4_ = 0;
        EC_01._M_value = local_140._M_value;
        EC_01._M_cat = local_140._M_cat;
        llvm::
        ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
        ErrorOr(__return_storage_ptr__,EC_01);
        goto LAB_002125fe;
      }
      if (local_120 == 0) {
        memset((void *)BytesLeft,0,NumRead);
        break;
      }
      BytesLeft = local_120 + BytesLeft;
    }
    llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)__return_storage_ptr__,
               (unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                *)&stack0xffffffffffffff08,(type *)0x0);
  }
  else {
    eVar5 = llvm::make_error_code(not_enough_memory);
    EC_00._M_cat = eVar5._M_cat;
    BufPtr._0_4_ = eVar5._M_value;
    EC_00._4_4_ = 0;
    EC_00._M_value = (uint)BufPtr;
    local_100 = EC_00._M_cat;
    llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ErrorOr(__return_storage_ptr__,EC_00);
  }
LAB_002125fe:
  Buf._M_t.
  super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
  .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl._4_4_ = 1;
  std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>::
  ~unique_ptr((unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
               *)&stack0xffffffffffffff08);
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getOpenFileImpl(int FD, const Twine &Filename, uint64_t FileSize,
                uint64_t MapSize, int64_t Offset, bool RequiresNullTerminator,
                bool IsVolatile) {
  static int PageSize = sys::Process::getPageSize();

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't trust the size. Create the memory
      // buffer by copying off the stream.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return getMemoryBufferForStream(FD, Filename);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  if (shouldUseMmap(FD, FileSize, MapSize, Offset, RequiresNullTerminator,
                    PageSize, IsVolatile)) {
    std::error_code EC;
    std::unique_ptr<MB> Result(
        new (NamedBufferAlloc(Filename)) MemoryBufferMMapFile<MB>(
            RequiresNullTerminator, FD, MapSize, Offset, EC));
    if (!EC)
      return std::move(Result);
  }

  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(MapSize, Filename);
  if (!Buf) {
    // Failed to create a buffer. The only way it can fail is if
    // new(std::nothrow) returns 0.
    return make_error_code(errc::not_enough_memory);
  }

  char *BufPtr = Buf.get()->getBufferStart();

  size_t BytesLeft = MapSize;
#ifndef HAVE_PREAD
  if (lseek(FD, Offset, SEEK_SET) == -1)
    return std::error_code(errno, std::generic_category());
#endif

  while (BytesLeft) {
#ifdef HAVE_PREAD
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::pread, FD, BufPtr, BytesLeft,
                                            MapSize - BytesLeft + Offset);
#else
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::read, FD, BufPtr, BytesLeft);
#endif
    if (NumRead == -1) {
      // Error while reading.
      return std::error_code(errno, std::generic_category());
    }
    if (NumRead == 0) {
      memset(BufPtr, 0, BytesLeft); // zero-initialize rest of the buffer.
      break;
    }
    BytesLeft -= NumRead;
    BufPtr += NumRead;
  }

  return std::move(Buf);
}